

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O3

void __thiscall t_ocaml_generator::generate_typedef(t_ocaml_generator *this,t_typedef *ttypedef)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  t_type *ptVar5;
  char *pcVar6;
  char local_c0 [8];
  undefined8 uStack_b8;
  char *local_b0;
  long local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  char *local_90;
  long local_88;
  char local_80 [8];
  undefined8 uStack_78;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_types_,local_50._M_dataplus._M_p,local_50._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"type ",5);
  pcVar1 = (ttypedef->symbolic_)._M_dataplus._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (ttypedef->symbolic_)._M_string_length);
  pcVar6 = local_90;
  iVar3 = tolower((int)*local_90);
  *pcVar6 = (char)iVar3;
  lVar2 = local_88;
  pcVar6 = local_90;
  if (local_90 == local_80) {
    uStack_b8 = uStack_78;
    pcVar6 = local_c0;
  }
  local_88 = 0;
  local_80[0] = '\0';
  local_90 = local_80;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  ptVar5 = t_typedef::get_type(ttypedef);
  render_ocaml_type_abi_cxx11_(&local_70,this,ptVar5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (pcVar6 != local_c0) {
    operator_delete(pcVar6);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_types_i_,local_50._M_dataplus._M_p,
                      local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"type ",5);
  pcVar1 = (ttypedef->symbolic_)._M_dataplus._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (ttypedef->symbolic_)._M_string_length);
  pcVar6 = local_b0;
  iVar3 = tolower((int)*local_b0);
  *pcVar6 = (char)iVar3;
  lVar2 = local_a8;
  pcVar6 = local_b0;
  if (local_b0 == local_a0) {
    uStack_b8 = uStack_98;
    pcVar6 = local_c0;
  }
  local_a8 = 0;
  local_a0[0] = '\0';
  local_b0 = local_a0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  ptVar5 = t_typedef::get_type(ttypedef);
  render_ocaml_type_abi_cxx11_(&local_70,this,ptVar5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (pcVar6 != local_c0) {
    operator_delete(pcVar6);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_typedef(t_typedef* ttypedef) {
  f_types_ << indent() << "type " << decapitalize(ttypedef->get_symbolic()) << " = "
           << render_ocaml_type(ttypedef->get_type()) << endl << endl;
  f_types_i_ << indent() << "type " << decapitalize(ttypedef->get_symbolic()) << " = "
             << render_ocaml_type(ttypedef->get_type()) << endl << endl;
}